

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# credits.c
# Opt level: O2

void destroy_credits(void)

{
  char **ppcVar1;
  CREDIT_NAME *__ptr;
  
  if (title_text == (char *)0x0) goto LAB_00108b88;
  __ptr = (CREDIT_NAME *)title_text;
  if ((title_alloced & 1) == 0) goto LAB_00108b88;
  while( true ) {
    free(__ptr);
LAB_00108b88:
    __ptr = credits;
    if (credits == (CREDIT_NAME *)0x0) break;
    cred = credits;
    ppcVar1 = &credits->name;
    credits = credits->next;
    free(*ppcVar1);
    free(__ptr->text);
  }
  return;
}

Assistant:

void destroy_credits(void)
{
   if ((title_text) && (title_alloced)) {
      free(title_text);
   }

   while (credits) {
      cred = credits;
      credits = cred->next;

      if (cred->name) {
         free(cred->name);
      }

      if (cred->text) {
         free(cred->text);
      }

      free(cred);
   }
}